

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::handletext(Fl_Input_ *this,int event,int X,int Y,int W,int H)

{
  int Y_00;
  int W_00;
  int H_00;
  bool bVar1;
  Fl_Window *pFVar2;
  byte *pbVar3;
  int iVar4;
  byte *text;
  byte bVar5;
  int iVar6;
  undefined4 in_register_00000014;
  Fl_Cursor c;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  text = (byte *)Fl::e_text;
  iVar8 = 0;
  if (0x10 < event - 1U) {
    return 0;
  }
  iVar4 = (&switchD_001837c2::switchdataD_001fca4c)[event - 1U] + 0x1fca4c;
  switch(event) {
  case 1:
    iVar8 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar8 != 0) &&
       (pFVar2 = Fl_Widget::window(&this->super_Fl_Widget), pFVar2 != (Fl_Window *)0x0)) {
      pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar2,FL_CURSOR_INSERT);
    }
    handle_mouse(this,X,Y,iVar4,W,Fl::e_state & 0x10000);
    iVar8 = 1;
    if ((Fl_Input_ *)Fl::focus_ != this) {
      Fl::focus(&this->super_Fl_Widget);
      (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    copy(this,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)CONCAT44(in_register_00000014,X));
    goto LAB_00183a8a;
  case 3:
  case 0xb:
    iVar8 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar8 == 0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    if (pFVar2 == (Fl_Window *)0x0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    c = FL_CURSOR_INSERT;
    goto LAB_001839d9;
  case 4:
    iVar8 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar8 == 0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    if (pFVar2 == (Fl_Window *)0x0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    c = FL_CURSOR_DEFAULT;
LAB_001839d9:
    iVar8 = 1;
    Fl_Window::cursor(pFVar2,c);
    break;
  case 5:
    iVar8 = 1;
    handle_mouse(this,X,Y,iVar4,W,1);
    break;
  case 6:
    iVar8 = this->textfont_;
    iVar4 = this->textsize_;
    iVar6 = (this->super_Fl_Widget).x_;
    Y_00 = (this->super_Fl_Widget).y_;
    W_00 = (this->super_Fl_Widget).w_;
    H_00 = (this->super_Fl_Widget).h_;
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    fl_set_spot(iVar8,iVar4,iVar6,Y_00,W_00,H_00,pFVar2);
    iVar8 = this->position_;
    iVar4 = this->mark_;
    if (iVar4 == iVar8) {
      iVar4 = this->size_ + 1;
    }
    else if (iVar8 < iVar4) {
      iVar4 = iVar8;
    }
    minimal_update(this,iVar4);
    goto LAB_00183a8a;
  case 7:
    iVar8 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar8 != 0) &&
       (pFVar2 = Fl_Widget::window(&this->super_Fl_Widget), pFVar2 != (Fl_Window *)0x0)) {
      pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar2,FL_CURSOR_DEFAULT);
    }
    iVar8 = this->position_;
    iVar4 = this->mark_;
    if (iVar4 == iVar8) {
      if (((this->super_Fl_Widget).damage_ & 2) == 0) {
        minimal_update(this,iVar4);
        this->erase_cursor_only = '\x01';
      }
    }
    else {
      if (iVar8 < iVar4) {
        iVar4 = iVar8;
      }
      minimal_update(this,iVar4);
    }
  case 0xf:
    fl_reset_spot();
    iVar8 = 1;
    if ((((this->super_Fl_Widget).type_ & 8) == 0) && (((this->super_Fl_Widget).when_ & 4) != 0)) {
      maybe_do_callback(this);
    }
    break;
  case 0xc:
    if (this->shortcut_ == 0) {
      iVar8 = Fl_Widget::test_shortcut(&this->super_Fl_Widget);
    }
    else {
      iVar8 = Fl::test_shortcut(this->shortcut_);
    }
    if (iVar8 == 0) {
      return 0;
    }
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (!bVar1) {
      return 0;
    }
    iVar8 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6);
    if (iVar8 == 0) {
      return 0;
    }
    Fl::focus(&this->super_Fl_Widget);
    goto LAB_00183a8a;
  case 0x11:
    bVar5 = (this->super_Fl_Widget).type_;
    if ((bVar5 & 8) == 0) {
      if (Fl::e_text == (char *)0x0) {
        return 1;
      }
      if ((long)Fl::e_length == 0) {
        return 1;
      }
      pbVar9 = (byte *)(Fl::e_text + Fl::e_length);
      bVar5 = bVar5 & 7;
      if (bVar5 == 4) {
        if (Fl::e_length < 1) {
          return 1;
        }
LAB_00183b80:
        iVar4 = this->position_;
        iVar6 = this->mark_;
        iVar8 = (int)pbVar9 - (int)text;
      }
      else {
        iVar8 = Fl::e_length + 2;
        pbVar10 = pbVar9;
        do {
          pbVar9 = pbVar10;
          if (pbVar9 <= text) {
            return 1;
          }
          iVar4 = isspace((uint)pbVar9[-1]);
          iVar8 = iVar8 + -1;
          pbVar10 = pbVar9 + -1;
        } while (iVar4 != 0);
        pbVar10 = text;
        if (bVar5 == 1) {
          do {
            text = pbVar10;
            bVar5 = *text;
            iVar4 = isspace((uint)bVar5);
            pbVar10 = text + 1;
            iVar8 = iVar8 + -1;
            if (pbVar9 <= text) break;
          } while (iVar4 != 0);
          if ((bVar5 != 0x2b) && (bVar5 != 0x2d)) {
            pbVar10 = text;
          }
          do {
            bVar5 = *pbVar10;
            pbVar11 = pbVar10 + 1;
            if (pbVar9 <= pbVar10) break;
            pbVar10 = pbVar11;
          } while (bVar5 - 0x30 < 10);
          if (bVar5 == 0x2e) {
            do {
              pbVar10 = pbVar11;
              pbVar11 = pbVar10 + 1;
              if (pbVar9 <= pbVar10) break;
            } while (*pbVar10 - 0x30 < 10);
            if ((*pbVar10 | 0x20) == 0x65) {
              if ((*pbVar11 == 0x2b) || (pbVar3 = pbVar11, *pbVar11 == 0x2d)) {
                pbVar3 = pbVar10 + 2;
              }
              do {
                pbVar11 = pbVar3 + 1;
                if (pbVar9 <= pbVar3) break;
                bVar5 = *pbVar3;
                pbVar3 = pbVar11;
              } while (bVar5 - 0x30 < 10);
            }
          }
        }
        else {
          if (bVar5 != 2) goto LAB_00183b80;
          do {
            text = pbVar10;
            bVar5 = *text;
            uVar7 = (uint)bVar5;
            iVar4 = isspace(uVar7);
            pbVar10 = text + 1;
            iVar8 = iVar8 + -1;
            if (pbVar9 <= text) break;
          } while (iVar4 != 0);
          if ((uVar7 == 0x2b) || (pbVar3 = text, uVar7 == 0x2d)) {
            bVar5 = *pbVar10;
            pbVar3 = pbVar10;
          }
          if ((bVar5 == 0x30) && (pbVar3[1] == 0x78)) {
            pbVar10 = pbVar3 + 2;
            do {
              iVar4 = isxdigit((uint)*pbVar10);
              pbVar11 = pbVar10 + 1;
              if (pbVar9 <= pbVar10) break;
              pbVar10 = pbVar11;
            } while (iVar4 != 0);
          }
          else {
            do {
              pbVar11 = pbVar3 + 1;
              if (pbVar9 <= pbVar3) break;
              bVar5 = *pbVar3;
              pbVar3 = pbVar11;
            } while (bVar5 - 0x30 < 10);
          }
        }
        if (pbVar11 + -1 < pbVar9) {
          fl_beep(2);
          return 1;
        }
        iVar6 = this->size_;
        iVar4 = 0;
      }
      iVar8 = replace(this,iVar4,iVar6,(char *)text,iVar8);
      return iVar8;
    }
    fl_beep(2);
LAB_00183a8a:
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Fl_Input_::handletext(int event, int X, int Y, int W, int H) {
  switch (event) {

  case FL_ENTER:
  case FL_MOVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);
    return 1;

  case FL_LEAVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    return 1;

  case FL_FOCUS:
    fl_set_spot(textfont(), textsize(), x(), y(), w(), h(), window());
    if (mark_ == position_) {
      minimal_update(size()+1);
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
    return 1;

  case FL_UNFOCUS:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    if (mark_ == position_) {
      if (!(damage()&FL_DAMAGE_EXPOSE)) {minimal_update(position_); erase_cursor_only = 1;}
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
  case FL_HIDE:
    fl_reset_spot();
    if (!readonly() && (when() & FL_WHEN_RELEASE))
      maybe_do_callback();
    return 1;

  case FL_PUSH:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);

    handle_mouse(X, Y, W, H, Fl::event_state(FL_SHIFT));

    if (Fl::focus() != this) {
      Fl::focus(this);
      handle(FL_FOCUS);
    }
    return 1;

  case FL_DRAG:
    handle_mouse(X, Y, W, H, 1);
    return 1;

  case FL_RELEASE:
    copy(0);
    return 1;

  case FL_PASTE: {
    // Don't allow pastes into readonly widgets...
    if (readonly()) {
      fl_beep(FL_BEEP_ERROR);
      return 1;
    }

    // See if we have anything to paste...
    if (!Fl::event_text() || !Fl::event_length()) return 1;

    // strip trailing control characters and spaces before pasting:
    const char* t = Fl::event_text();
    const char* e = t+Fl::event_length();
    if (input_type() != FL_MULTILINE_INPUT) while (e > t && isspace(*(e-1) & 255)) e--;
    if (!t || e <= t) return 1; // Int/float stuff will crash without this test
    if (input_type() == FL_INT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      if (strncmp(p, "0x", 2) == 0) {
        p += 2;
        while (isxdigit(*p & 255) && p < e) p ++;
      } else {
        while (isdigit(*p & 255) && p < e) p ++;
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    } else if (input_type() == FL_FLOAT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      while (isdigit(*p & 255) && p < e) p ++;
      if (*p == '.') {
        p ++;
        while (isdigit(*p & 255) && p < e) p ++;
	if (*p == 'e' || *p == 'E') {
	  p ++;
	  if (*p == '+' || *p == '-') p ++;
	  while (isdigit(*p & 255) && p < e) p ++;
	}
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    }
    return replace(position(), mark(), t, (int) (e-t));}

  case FL_SHORTCUT:
    if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut())) 
      return 0;
    if (Fl::visible_focus() && handle(FL_FOCUS)) {
      Fl::focus(this);
      return 1;
    } // else fall through

  default:
    return 0;
  }
}